

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestResultCollector.cpp
# Opt level: O0

void __thiscall CppUnit::TestResultCollector::freeFailures(TestResultCollector *this)

{
  bool bVar1;
  reference ppTVar2;
  _Self local_70;
  iterator local_50;
  undefined1 local_30 [8];
  iterator itFailure;
  TestResultCollector *this_local;
  
  itFailure._M_node = (_Map_pointer)this;
  std::deque<CppUnit::TestFailure_*,_std::allocator<CppUnit::TestFailure_*>_>::begin
            ((iterator *)local_30,&this->m_failures);
  while( true ) {
    std::deque<CppUnit::TestFailure_*,_std::allocator<CppUnit::TestFailure_*>_>::end
              (&local_50,&this->m_failures);
    bVar1 = std::operator!=((_Self *)local_30,&local_50);
    if (!bVar1) break;
    std::_Deque_iterator<CppUnit::TestFailure_*,_CppUnit::TestFailure_*&,_CppUnit::TestFailure_**>::
    operator++(&local_70,
               (_Deque_iterator<CppUnit::TestFailure_*,_CppUnit::TestFailure_*&,_CppUnit::TestFailure_**>
                *)local_30,0);
    ppTVar2 = std::
              _Deque_iterator<CppUnit::TestFailure_*,_CppUnit::TestFailure_*&,_CppUnit::TestFailure_**>
              ::operator*(&local_70);
    if (*ppTVar2 != (TestFailure *)0x0) {
      (*(*ppTVar2)->_vptr_TestFailure[1])();
    }
  }
  std::deque<CppUnit::TestFailure_*,_std::allocator<CppUnit::TestFailure_*>_>::clear
            (&this->m_failures);
  return;
}

Assistant:

void 
TestResultCollector::freeFailures()
{
  TestFailures::iterator itFailure = m_failures.begin();
  while ( itFailure != m_failures.end() )
    delete *itFailure++;
  m_failures.clear();
}